

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.hpp
# Opt level: O0

unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridGlobal>::read<TasGrid::IO::mode_ascii_type>
          (GridReaderVersion5<TasGrid::GridGlobal> *this,AccelerationContext *acc,istream *is)

{
  istream *piVar1;
  bool bVar2;
  int iVar3;
  TypeOneDRule TVar4;
  uint uVar5;
  pointer pGVar6;
  reference piVar7;
  pointer pGVar8;
  double dVar9;
  MultiIndexSet *local_3d0;
  OneDimensionalWrapper local_330;
  int *local_278;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_270;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_268;
  vector<int,_std::allocator<int>_> local_260;
  MultiIndexSet local_240;
  MultiIndexSet local_210;
  int local_1e8;
  int oned_max_level;
  vector<int,_std::allocator<int>_> local_1b8;
  MultiIndexSet local_198;
  MultiIndexSet local_168;
  vector<int,_std::allocator<int>_> local_140;
  MultiIndexSet local_120;
  MultiIndexSet local_f0;
  CustomTabulated local_c0;
  undefined1 local_21;
  istream *local_20;
  istream *is_local;
  AccelerationContext *acc_local;
  unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *grid;
  
  local_21 = 0;
  local_20 = is;
  is_local = (istream *)acc;
  acc_local = (AccelerationContext *)this;
  Utils::make_unique<TasGrid::GridGlobal,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,(AccelerationContext **)&is_local);
  iVar3 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(local_20);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  (pGVar6->super_BaseCanonicalGrid).num_dimensions = iVar3;
  iVar3 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(local_20);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  (pGVar6->super_BaseCanonicalGrid).num_outputs = iVar3;
  dVar9 = IO::readNumber<TasGrid::IO::mode_ascii_type,double>(local_20);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  pGVar6->alpha = dVar9;
  dVar9 = IO::readNumber<TasGrid::IO::mode_ascii_type,double>(local_20);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  pGVar6->beta = dVar9;
  TVar4 = IO::readRule<TasGrid::IO::mode_ascii_type>(local_20);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  pGVar6->rule = TVar4;
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  if (pGVar6->rule == rule_customtabulated) {
    CustomTabulated::CustomTabulated<TasGrid::IO::mode_ascii_type>(&local_c0,local_20);
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    CustomTabulated::operator=(&pGVar6->custom,&local_c0);
    CustomTabulated::~CustomTabulated(&local_c0);
  }
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_f0,local_20);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  MultiIndexSet::operator=(&pGVar6->tensors,&local_f0);
  MultiIndexSet::~MultiIndexSet(&local_f0);
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_120,local_20);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  MultiIndexSet::operator=(&pGVar6->active_tensors,&local_120);
  MultiIndexSet::~MultiIndexSet(&local_120);
  piVar1 = local_20;
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  uVar5 = MultiIndexSet::getNumIndexes(&pGVar6->active_tensors);
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            (&local_140,(IO *)piVar1,(istream *)(ulong)uVar5,TVar4);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  ::std::vector<int,_std::allocator<int>_>::operator=(&pGVar6->active_w,&local_140);
  ::std::vector<int,_std::allocator<int>_>::~vector(&local_140);
  bVar2 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
  if (bVar2) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_168,local_20);
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    MultiIndexSet::operator=(&(pGVar6->super_BaseCanonicalGrid).points,&local_168);
    MultiIndexSet::~MultiIndexSet(&local_168);
  }
  bVar2 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
  if (bVar2) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_198,local_20);
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    MultiIndexSet::operator=(&(pGVar6->super_BaseCanonicalGrid).needed,&local_198);
    MultiIndexSet::~MultiIndexSet(&local_198);
  }
  piVar1 = local_20;
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            (&local_1b8,(IO *)piVar1,
             (istream *)(ulong)(uint)(pGVar6->super_BaseCanonicalGrid).num_dimensions,TVar4);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  ::std::vector<int,_std::allocator<int>_>::operator=(&pGVar6->max_levels,&local_1b8);
  ::std::vector<int,_std::allocator<int>_>::~vector(&local_1b8);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  if (0 < (pGVar6->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::StorageSet<TasGrid::IO::mode_ascii_type>((StorageSet *)&oned_max_level,local_20);
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    StorageSet::operator=(&(pGVar6->super_BaseCanonicalGrid).values,(StorageSet *)&oned_max_level);
    StorageSet::~StorageSet((StorageSet *)&oned_max_level);
  }
  bVar2 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
  if (bVar2) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_210,local_20);
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    MultiIndexSet::operator=(&pGVar6->updated_tensors,&local_210);
    MultiIndexSet::~MultiIndexSet(&local_210);
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    local_1e8 = MultiIndexSet::getMaxIndex(&pGVar6->updated_tensors);
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_240,local_20);
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    MultiIndexSet::operator=(&pGVar6->updated_active_tensors,&local_240);
    MultiIndexSet::~MultiIndexSet(&local_240);
    piVar1 = local_20;
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    uVar5 = MultiIndexSet::getNumIndexes(&pGVar6->updated_active_tensors);
    IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
              (&local_260,(IO *)piVar1,(istream *)(ulong)uVar5,TVar4);
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    ::std::vector<int,_std::allocator<int>_>::operator=(&pGVar6->updated_active_w,&local_260);
    ::std::vector<int,_std::allocator<int>_>::~vector(&local_260);
  }
  else {
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    local_270._M_current =
         (int *)::std::vector<int,_std::allocator<int>_>::begin(&pGVar6->max_levels);
    pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    local_278 = (int *)::std::vector<int,_std::allocator<int>_>::end(&pGVar6->max_levels);
    local_268 = ::std::
                max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          (local_270,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           local_278);
    piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_268);
    local_1e8 = *piVar7;
  }
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  iVar3 = local_1e8;
  pGVar8 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  TVar4 = pGVar8->rule;
  pGVar8 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  dVar9 = pGVar8->alpha;
  pGVar8 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  OneDimensionalWrapper::OneDimensionalWrapper
            (&local_330,&pGVar6->custom,iVar3,TVar4,dVar9,pGVar8->beta);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  OneDimensionalWrapper::operator=(&pGVar6->wrapper,&local_330);
  OneDimensionalWrapper::~OneDimensionalWrapper(&local_330);
  pGVar6 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  pGVar8 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
           operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> *)
                      this);
  bVar2 = MultiIndexSet::empty(&(pGVar8->super_BaseCanonicalGrid).points);
  if (bVar2) {
    pGVar8 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    local_3d0 = &(pGVar8->super_BaseCanonicalGrid).needed;
  }
  else {
    pGVar8 = ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::
             operator->((unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>
                         *)this);
    local_3d0 = &(pGVar8->super_BaseCanonicalGrid).points;
  }
  GridGlobal::recomputeTensorRefs(pGVar6,local_3d0);
  return (__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
         )(__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
           )this;
}

Assistant:

static std::unique_ptr<GridGlobal> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridGlobal> grid = Utils::make_unique<GridGlobal>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);
        grid->alpha = IO::readNumber<iomode, double>(is);
        grid->beta = IO::readNumber<iomode, double>(is);
        grid->rule = IO::readRule<iomode>(is);
        if (grid->rule == rule_customtabulated) grid->custom = CustomTabulated(is, iomode());
        grid->tensors = MultiIndexSet(is, iomode());
        grid->active_tensors = MultiIndexSet(is, iomode());
        grid->active_w = IO::readVector<iomode, int>(is, grid->active_tensors.getNumIndexes());

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        grid->max_levels = IO::readVector<iomode, int>(is, grid->num_dimensions);

        if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        int oned_max_level;
        if (IO::readFlag<iomode>(is)){
            grid->updated_tensors = MultiIndexSet(is, iomode());
            oned_max_level = grid->updated_tensors.getMaxIndex();

            grid->updated_active_tensors = MultiIndexSet(is, iomode());

            grid->updated_active_w = IO::readVector<iomode, int>(is, grid->updated_active_tensors.getNumIndexes());
        }else{
            oned_max_level = *std::max_element(grid->max_levels.begin(), grid->max_levels.end());
        }

        grid->wrapper = OneDimensionalWrapper(grid->custom, oned_max_level, grid->rule, grid->alpha, grid->beta);

        grid->recomputeTensorRefs((grid->points.empty()) ? grid->needed : grid->points);

        return grid;
    }